

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool Catch::compareEqual<std::basic_string_view<char,std::char_traits<char>>,char[3]>
               (basic_string_view<char,_std::char_traits<char>_> *lhs,char (*rhs) [3])

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  size_t sVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  __x = *lhs;
  sVar2 = strlen(*rhs);
  __y._M_str = *rhs;
  __y._M_len = sVar2;
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }